

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O2

void __thiscall
QWindowContainer::QWindowContainer
          (QWindowContainer *this,QWindow *embeddedWindow,QWidget *parent,WindowFlags flags)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QWindowContainerPrivate *this_00;
  QObject *pQVar5;
  QWindow *pQVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QAnyStringView QVar8;
  Object local_c8 [8];
  Object local_c0 [8];
  QArrayDataPointer<char16_t> local_b8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_98 [2];
  QByteArrayView local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWindowContainerPrivate *)operator_new(0x298);
  QWindowContainerPrivate::QWindowContainerPrivate(this_00);
  QWidget::QWidget((QWidget *)this,(QWidgetPrivate *)this_00,parent,flags);
  *(undefined ***)this = &PTR_metaObject_007c22c0;
  *(undefined ***)(this + 0x10) = &PTR__QWindowContainer_007c2470;
  if (embeddedWindow == (QWindow *)0x0) {
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_40 = "default";
    QMessageLogger::warning((char *)&local_58,"QWindowContainer: embedded window cannot be null");
  }
  else {
    lVar1 = *(long *)(this + 8);
    QWeakPointer<QObject>::assign<QObject>
              ((QWeakPointer<QObject> *)(lVar1 + 600),(QObject *)embeddedWindow);
    QObject::installEventFilter(*(QObject **)(lVar1 + 0x260));
    local_58.size._0_4_ = 0xaaaaaaaa;
    local_58.size._4_4_ = 0xaaaaaaaa;
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.ptr._0_4_ = 0xaaaaaaaa;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    QObject::objectName();
    if (CONCAT44(local_58.size._4_4_,(undefined4)local_58.size) == 0) {
      (**(code **)**(undefined8 **)(lVar1 + 0x260))();
      local_b8.d = (Data *)QMetaObject::className();
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_88,(char **)&local_b8);
      QVar7.m_data = (storage_type *)local_88.m_size;
      QVar7.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar7);
      pDVar2 = (Data *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
      pcVar3 = (char16_t *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
      local_58.d._0_4_ = SUB84(local_78.d,0);
      local_58.d._4_4_ = (undefined4)((ulong)local_78.d >> 0x20);
      local_58.ptr._0_4_ = SUB84(local_78.ptr,0);
      local_58.ptr._4_4_ = (undefined4)((ulong)local_78.ptr >> 0x20);
      qVar4 = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
      local_58.size._0_4_ = (undefined4)local_78.size;
      local_58.size._4_4_ = (undefined4)((ulong)local_78.size >> 0x20);
      local_78.d = pDVar2;
      local_78.ptr = pcVar3;
      local_78.size = qVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    }
    local_78.ptr = (char16_t *)0x13;
    local_78.size = 0x5eb9da;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char16_t *)0x0;
    local_b8.size = 0;
    local_78.d = (Data *)&local_58;
    QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
              ((QAnyStringView *)local_98,(QStringBuilder<QString_&,_QLatin1String> *)&local_78,
               (wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> *)&local_b8);
    QVar8.m_size = (size_t)local_98[0].m_data;
    QVar8.field_0.m_data = (void *)(lVar1 + 0x268);
    QObject::setObjectName(QVar8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QWindow::setParent(*(QWindow **)(lVar1 + 0x260));
    pQVar5 = (QObject *)QWindow::parent(*(undefined8 *)(lVar1 + 0x260),0);
    QObject::installEventFilter(pQVar5);
    QWindow::setFlag((WindowType)*(undefined8 *)(lVar1 + 0x260),true);
    QWidget::setAcceptDrops((QWidget *)this,true);
    pQVar6 = containedWindow(this);
    local_78.d = (Data *)QWidget::updateGeometry;
    local_78.ptr = (char16_t *)0x0;
    QObject::connect<void(QWindow::*)(int),void(QWidget::*)()>
              (local_c0,(offset_in_QWindow_to_subr)pQVar6,
               (ContextType *)QWindow::minimumHeightChanged,(offset_in_QWidget_to_subr *)0x0,
               (ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_c0);
    pQVar6 = containedWindow(this);
    local_78.d = (Data *)QWidget::updateGeometry;
    local_78.ptr = (char16_t *)0x0;
    QObject::connect<void(QWindow::*)(int),void(QWidget::*)()>
              (local_c8,(offset_in_QWindow_to_subr)pQVar6,
               (ContextType *)QWindow::minimumWidthChanged,(offset_in_QWidget_to_subr *)0x0,
               (ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWindowContainer::QWindowContainer(QWindow *embeddedWindow, QWidget *parent, Qt::WindowFlags flags)
    : QWidget(*new QWindowContainerPrivate, parent, flags)
{
    Q_D(QWindowContainer);
    if (Q_UNLIKELY(!embeddedWindow)) {
        qWarning("QWindowContainer: embedded window cannot be null");
        return;
    }

    d->window = embeddedWindow;
    d->window->installEventFilter(this);

    QString windowName = d->window->objectName();
    if (windowName.isEmpty())
        windowName = QString::fromUtf8(d->window->metaObject()->className());
    d->fakeParent.setObjectName(windowName + "ContainerFakeParent"_L1);

    d->window->setParent(&d->fakeParent);
    d->window->parent()->installEventFilter(this);
    d->window->setFlag(Qt::SubWindow);

    setAcceptDrops(true);

    connect(containedWindow(), &QWindow::minimumHeightChanged, this, &QWindowContainer::updateGeometry);
    connect(containedWindow(), &QWindow::minimumWidthChanged, this, &QWindowContainer::updateGeometry);
}